

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
          (string *__return_storage_ptr__,MatcherUntypedBase *this)

{
  string local_40 [32];
  
  if ((this->m_cachedToString)._M_string_length == 0) {
    (*this->_vptr_MatcherUntypedBase[2])(local_40);
    std::__cxx11::string::operator=((string *)&this->m_cachedToString,local_40);
    std::__cxx11::string::~string(local_40);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_cachedToString);
  return __return_storage_ptr__;
}

Assistant:

std::string MatcherUntypedBase::toString() const {
                if (m_cachedToString.empty())
                    m_cachedToString = describe();
                return m_cachedToString;
            }